

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5d835d::CtorVtableSpecialName::printLeft
          (CtorVtableSpecialName *this,OutputStream *S)

{
  Node *pNVar1;
  
  OutputStream::grow(S,0x18);
  builtin_strncpy(S->Buffer + S->CurrentPosition,"construction vtable for ",0x18);
  S->CurrentPosition = S->CurrentPosition + 0x18;
  pNVar1 = this->FirstType;
  (*pNVar1->_vptr_Node[4])(pNVar1,S);
  if (pNVar1->RHSComponentCache != No) {
    (*pNVar1->_vptr_Node[5])(pNVar1,S);
  }
  OutputStream::grow(S,4);
  builtin_strncpy(S->Buffer + S->CurrentPosition,"-in-",4);
  S->CurrentPosition = S->CurrentPosition + 4;
  pNVar1 = this->SecondType;
  (*pNVar1->_vptr_Node[4])(pNVar1,S);
  if (pNVar1->RHSComponentCache == No) {
    return;
  }
  (*pNVar1->_vptr_Node[5])(pNVar1,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "construction vtable for ";
    FirstType->print(S);
    S += "-in-";
    SecondType->print(S);
  }